

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O1

void __thiscall QGraphicsTransformPrivate::setItem(QGraphicsTransformPrivate *this,QGraphicsItem *i)

{
  undefined1 *puVar1;
  QGraphicsItem *this_00;
  QWindow *pQVar2;
  QGraphicsItemPrivate *pQVar3;
  long in_FS_OFFSET;
  QWindow *local_38;
  anon_class_8_1_54a39814_for__M_pred local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->item;
  if (this_00 != i) {
    if (this_00 != (QGraphicsItem *)0x0) {
      pQVar2 = *(QWindow **)&this->field_0x8;
      pQVar3 = (this_00->d_ptr).d;
      QGraphicsItem::prepareGeometryChange(this_00);
      local_38 = pQVar2;
      local_30.t = &local_38;
      QtPrivate::
      sequential_erase_if<QList<QGraphicsTransform*>,QtPrivate::sequential_erase<QList<QGraphicsTransform*>,QGraphicsTransform*>(QList<QGraphicsTransform*>&,QGraphicsTransform*const&)::_lambda(auto:1_const&)_1_>
                (&pQVar3->transformData->graphicsTransforms,&local_30);
      puVar1 = &pQVar3->field_0x166;
      *puVar1 = *puVar1 | 0x20;
      this->item = (QGraphicsItem *)0x0;
    }
    this->item = i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsTransformPrivate::setItem(QGraphicsItem *i)
{
    if (item == i)
        return;

    if (item) {
        Q_Q(QGraphicsTransform);
        QGraphicsItemPrivate *d_ptr = item->d_ptr.data();

        item->prepareGeometryChange();
        Q_ASSERT(d_ptr->transformData);
        d_ptr->transformData->graphicsTransforms.removeAll(q);
        d_ptr->dirtySceneTransform = 1;
        item = nullptr;
    }

    item = i;
}